

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DFraggleThinker::Destroy(DFraggleThinker *this)

{
  DRunningScript *pDVar1;
  DRunningScript *pDVar2;
  DFsScript *pDVar3;
  DRunningScript *q;
  
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&this->RunningScripts);
  while (pDVar1 != (DRunningScript *)0x0) {
    pDVar2 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&pDVar1->next);
    (pDVar1->prev).field_0.p = (DRunningScript *)0x0;
    (pDVar1->next).field_0.p = (DRunningScript *)0x0;
    (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
    pDVar1 = pDVar2;
  }
  (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
  pDVar3 = GC::ReadBarrier<DFsScript>((DFsScript **)&this->LevelScript);
  (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
  (this->LevelScript).field_0.p = (DFsScript *)0x0;
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Clear(&this->SpawnedThings);
  ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFraggleThinker>_1)0x0;
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DFraggleThinker::Destroy()
{
	DRunningScript *p = RunningScripts;
	while (p)
	{
		DRunningScript *q = p;
		p = p->next;
		q->prev = q->next = NULL;
		q->Destroy();
	}
	RunningScripts = NULL;

	LevelScript->Destroy();
	LevelScript = NULL;

	SpawnedThings.Clear();
	ActiveThinker = NULL;
	Super::Destroy();
}